

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2point_vector_layer.cc
# Opt level: O3

void __thiscall
s2builderutil::S2PointVectorLayer::Build(S2PointVectorLayer *this,Graph *g,S2Error *error)

{
  vector<Vector3<double>,std::allocator<Vector3<double>>> *this_00;
  iterator __position;
  vector<int,std::allocator<int>> *this_01;
  iterator __position_00;
  VType VVar1;
  pointer ppVar2;
  Vector3<double> *__args;
  ulong uVar3;
  int set_id;
  vector<int,_std::allocator<int>_> labels;
  LabelFetcher fetcher;
  int32 local_7c;
  vector<int,_std::allocator<int>_> local_78;
  LabelFetcher local_58;
  
  S2Builder::Graph::LabelFetcher::LabelFetcher(&local_58,g,DIRECTED);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ppVar2 = (g->edges_->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((g->edges_->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    uVar3 = 0;
    do {
      if (ppVar2[uVar3].first == ppVar2[uVar3].second) {
        __args = (g->vertices_->
                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
                 super__Vector_impl_data._M_start + ppVar2[uVar3].first;
        this_00 = (vector<Vector3<double>,std::allocator<Vector3<double>>> *)this->points_;
        __position._M_current = *(Vector3<double> **)(this_00 + 8);
        if (__position._M_current == *(Vector3<double> **)(this_00 + 0x10)) {
          std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
          _M_realloc_insert<Vector3<double>const&>(this_00,__position,__args);
        }
        else {
          (__position._M_current)->c_[2] = __args->c_[2];
          VVar1 = __args->c_[1];
          (__position._M_current)->c_[0] = __args->c_[0];
          (__position._M_current)->c_[1] = VVar1;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x18;
        }
        if (this->label_set_ids_ != (LabelSetIds *)0x0) {
          S2Builder::Graph::LabelFetcher::Fetch(&local_58,(EdgeId)uVar3,&local_78);
          local_7c = IdSetLexicon::
                     Add<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                               (this->label_set_lexicon_,
                                (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                 )local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                 )local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish);
          this_01 = (vector<int,std::allocator<int>> *)this->label_set_ids_;
          __position_00._M_current = *(int **)(this_01 + 8);
          if (__position_00._M_current == *(int **)(this_01 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this_01,__position_00,&local_7c);
          }
          else {
            *__position_00._M_current = local_7c;
            *(int **)(this_01 + 8) = __position_00._M_current + 1;
          }
        }
      }
      else {
        S2Error::Init(error,INVALID_ARGUMENT,"Found non-degenerate edges");
      }
      uVar3 = uVar3 + 1;
      ppVar2 = (g->edges_->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(g->edges_->
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 3))
    ;
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_58.sibling_map_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.sibling_map_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void S2PointVectorLayer::Build(const Graph& g, S2Error* error) {
  Graph::LabelFetcher fetcher(g, EdgeType::DIRECTED);

  vector<Label> labels;  // Temporary storage for labels.
  for (EdgeId edge_id = 0; edge_id < g.edges().size(); edge_id++) {
    auto& edge = g.edge(edge_id);
    if (edge.first != edge.second) {
      error->Init(S2Error::INVALID_ARGUMENT, "Found non-degenerate edges");
      continue;
    }
    points_->push_back(g.vertex(edge.first));
    if (label_set_ids_) {
      fetcher.Fetch(edge_id, &labels);
      int set_id = label_set_lexicon_->Add(labels);
      label_set_ids_->push_back(set_id);
    }
  }
}